

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O1

size_t interpretBase(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm)

{
  UInt32 *pUVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  char (*__s) [8];
  
  if (((pMyDisasm->Reserved_).BASE_ == 5) && ((pMyDisasm->Reserved_).MOD_ == 0)) {
    pUVar1 = &(pMyDisasm->Reserved_).DECALAGE_EIP;
    *pUVar1 = *pUVar1 + 4;
    uVar3 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar3 == 0) || ((pMyDisasm->Reserved_).EIP_ + 7 <= uVar3)) {
      sVar5 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i,"%.8X",
                                  (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 3));
      i = i + sVar5;
      (pMyOperand->Memory).Displacement = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 3);
    }
    else {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
  }
  else {
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      pMyOperand->OpMnemonic[i + 2] = '\0';
      (pMyOperand->OpMnemonic + i)[0] = '(';
      (pMyOperand->OpMnemonic + i)[1] = '%';
      i = i + 2;
    }
    iVar2 = (pMyDisasm->Reserved_).AddressSize;
    if (iVar2 == 0x20) {
      lVar4 = (long)(pMyDisasm->Reserved_).BASE_;
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        strcpy(pMyOperand->OpMnemonic + i,Registers32Bits[lVar4]);
        iVar2 = (pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[iVar2];
        __s = Registers32Bits + iVar2;
      }
      else {
        strcpy(pMyOperand->OpMnemonic + i,Registers32Bits[lVar4 + 8]);
        lVar4 = (long)(pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[lVar4 + 8];
        __s = Registers32Bits + lVar4 + 8;
      }
    }
    else {
      if (iVar2 != 0x40) {
        return i;
      }
      lVar4 = (long)(pMyDisasm->Reserved_).BASE_;
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        strcpy(pMyOperand->OpMnemonic + i,Registers64Bits[lVar4]);
        iVar2 = (pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[iVar2];
        __s = (char (*) [8])(Registers64Bits + iVar2);
      }
      else {
        strcpy(pMyOperand->OpMnemonic + i,Registers64Bits[lVar4 + 8]);
        lVar4 = (long)(pMyDisasm->Reserved_).BASE_;
        (pMyOperand->Memory).BaseRegister = REGS[lVar4 + 8];
        __s = (char (*) [8])(Registers64Bits + lVar4 + 8);
      }
    }
    sVar6 = strlen(*__s);
    i = i + sVar6;
  }
  return i;
}

Assistant:

size_t __bea_callspec__ interpretBase(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm)
{
  size_t j;
  if ((GV.BASE_  == 5) && (GV.MOD_ == 0)) {
    GV.DECALAGE_EIP += 4;
    if (!Security(7, pMyDisasm)) return i;
    j = i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) *((UInt32*) (GV.EIP_+3)));
    #endif
    pMyOperand->Memory.Displacement = *((UInt32*) (GV.EIP_+3));
  }
  else {
    if (GV.SYNTAX_ == ATSyntax) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(%");
      #endif
      i += 2;
    }
    if (GV.AddressSize == 64) {
      if (GV.REX.B_ == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers64Bits[GV.BASE_ ]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ ];
        i += strlen(Registers64Bits[GV.BASE_ ]);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers64Bits[GV.BASE_ +8]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ +8];
        i += strlen( Registers64Bits[GV.BASE_ +8]);
      }
    }
    else if (GV.AddressSize == 32) {
      if (GV.REX.B_ == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers32Bits[GV.BASE_ ]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ ];
        i += strlen( Registers32Bits[GV.BASE_ ]);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers32Bits[GV.BASE_ +8]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ +8];
        i += strlen( Registers32Bits[GV.BASE_ +8]);
      }
    }
  }
  return i;
}